

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Value * __thiscall
soul::heart::AggregateInitialiserList::getAsConstant
          (Value *__return_storage_ptr__,AggregateInitialiserList *this)

{
  bool bVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  Expression *pEVar3;
  SubElementPath local_128;
  int local_ec;
  undefined1 local_e8 [8];
  Value v;
  pool_ref<soul::heart::Expression> *i;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *__range2;
  size_t index;
  Type local_70;
  undefined1 local_58 [8];
  Value result;
  AggregateInitialiserList *this_local;
  
  result.allocatedData.allocatedData.space[0] = (uint64_t)this;
  Type::Type(&local_70,&this->type);
  soul::Value::zeroInitialiser((Value *)local_58,&local_70);
  Type::~Type(&local_70);
  __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)0x0;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin(&this->items)
  ;
  ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end(&this->items);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    v.allocatedData.allocatedData.space[0] = (uint64_t)__end2;
    pEVar3 = pool_ref<soul::heart::Expression>::operator->(__end2);
    (*(pEVar3->super_Object)._vptr_Object[7])(local_e8);
    bVar1 = soul::Value::isValid((Value *)local_e8);
    if (bVar1) {
      bVar1 = Type::isStruct(&this->type);
      if (!bVar1) {
        bVar1 = Type::isFixedSizeArray(&this->type);
        if (!bVar1) {
          bVar1 = Type::isVector(&this->type);
          if (!bVar1) {
            soul::Value::castToTypeExpectingSuccess
                      (__return_storage_ptr__,(Value *)local_e8,&this->type);
            local_ec = 1;
            goto LAB_0041a2dd;
          }
        }
      }
      SubElementPath::SubElementPath(&local_128,(size_t)__range2);
      soul::Value::modifySubElementInPlace((Value *)local_58,&local_128,(Value *)local_e8);
      SubElementPath::~SubElementPath(&local_128);
      local_ec = 0;
      __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                 ((long)&__range2->items + 1);
    }
    else {
      soul::Value::Value(__return_storage_ptr__);
      local_ec = 1;
    }
LAB_0041a2dd:
    soul::Value::~Value((Value *)local_e8);
    if (local_ec != 0) goto LAB_0041a350;
  }
  soul::Value::Value(__return_storage_ptr__,(Value *)local_58);
  local_ec = 1;
LAB_0041a350:
  soul::Value::~Value((Value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto result = Value::zeroInitialiser (type);
            size_t index = 0;

            for (auto& i : items)
            {
                auto v = i->getAsConstant();

                if (! v.isValid())
                    return {};

                if (! (type.isStruct() || type.isFixedSizeArray() || type.isVector()))
                    return v.castToTypeExpectingSuccess (type);

                result.modifySubElementInPlace (index++, v);
            }

            return result;
        }